

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

Vec_Int_t * Tim_ManAlignTwo(Tim_Man_t *pSpec,Tim_Man_t *pImpl)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *p;
  int local_34;
  int i;
  Tim_Box_t *pBox;
  Vec_Int_t *vBoxPres;
  Tim_Man_t *pImpl_local;
  Tim_Man_t *pSpec_local;
  
  iVar1 = Tim_ManBoxNum(pSpec);
  iVar2 = Tim_ManBoxNum(pImpl);
  if (iVar1 <= iVar2) {
    __assert_fail("Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x160,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pImpl->vBoxes);
    if (iVar1 <= local_34) {
      iVar1 = Tim_ManBoxNum(pSpec);
      p = Vec_IntStart(iVar1);
      local_34 = 0;
      while( true ) {
        iVar1 = Vec_PtrSize(pImpl->vBoxes);
        if (iVar1 <= local_34) {
          return p;
        }
        pvVar3 = Vec_PtrEntry(pImpl->vBoxes,local_34);
        iVar1 = Vec_IntEntry(p,*(int *)((long)pvVar3 + 0x14));
        if (iVar1 != 0) break;
        Vec_IntWriteEntry(p,*(int *)((long)pvVar3 + 0x14),1);
        local_34 = local_34 + 1;
      }
      __assert_fail("!Vec_IntEntry(vBoxPres, pBox->iCopy)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x169,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
    }
    pvVar3 = Vec_PtrEntry(pImpl->vBoxes,local_34);
    if ((*(int *)((long)pvVar3 + 0x14) < 0) ||
       (iVar1 = *(int *)((long)pvVar3 + 0x14), iVar2 = Tim_ManBoxNum(pSpec), iVar2 <= iVar1)) break;
    local_34 = local_34 + 1;
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Tim_ManAlignTwo( Tim_Man_t * pSpec, Tim_Man_t * pImpl )
{
    Vec_Int_t * vBoxPres;
    Tim_Box_t * pBox;
    int i;
    assert( Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl) );
    // check if boxes of pImpl can be aligned
    Tim_ManForEachBox( pImpl, pBox, i )
        if ( pBox->iCopy < 0 || pBox->iCopy >= Tim_ManBoxNum(pSpec) ) 
            return NULL;
    // map dropped boxes into 1, others into 0
    vBoxPres = Vec_IntStart( Tim_ManBoxNum(pSpec) );
    Tim_ManForEachBox( pImpl, pBox, i )
    {
        assert( !Vec_IntEntry(vBoxPres, pBox->iCopy) );
        Vec_IntWriteEntry( vBoxPres, pBox->iCopy, 1 );
    }
    return vBoxPres;
}